

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O1

CTcSymbol * CTcSymEnumBase::read_from_sym_file(CVmFile *fp)

{
  CTcPrsSymtab *this;
  _func_int **pp_Var1;
  char *__s;
  size_t sVar2;
  CVmHashEntry *this_00;
  char *siz;
  char buf [32];
  char buf_1 [81];
  byte local_98 [32];
  char local_78 [88];
  
  this_00 = (CVmHashEntry *)0x0;
  __s = CTcParser::read_len_prefix_str(fp,local_78,0x51,(size_t *)0x0,0x2db6);
  if (__s != (char *)0x0) {
    CVmFile::read_bytes(fp,(char *)local_98,1);
    this = G_prs->global_symtab_;
    sVar2 = strlen(__s);
    siz = __s;
    this_00 = (CVmHashEntry *)CTcPrsSymtab::find(this,__s,sVar2,(CTcPrsSymtab **)0x0);
    if ((this_00 == (CVmHashEntry *)0x0) || (*(int *)&this_00->field_0x24 != 10)) {
      this_00 = (CVmHashEntry *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x38,(size_t)siz);
      sVar2 = strlen(__s);
      pp_Var1 = (_func_int **)G_prs->next_enum_id_;
      G_prs->next_enum_id_ = (long)pp_Var1 + 1;
      CVmHashEntry::CVmHashEntry(this_00,__s,sVar2,0);
      *(undefined4 *)&this_00->field_0x24 = 10;
      this_00[1]._vptr_CVmHashEntry = pp_Var1;
      *(byte *)&this_00[1].nxt_ = *(byte *)&this_00[1].nxt_ & 0xfc | local_98[0] & 1;
      this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00320ad8;
    }
    else if ((local_98[0] & 1) != 0) {
      *(byte *)&this_00[1].nxt_ = *(byte *)&this_00[1].nxt_ | 1;
    }
  }
  return (CTcSymbol *)this_00;
}

Assistant:

CTcSymbol *CTcSymEnumBase::read_from_sym_file(CVmFile *fp)
{
    const char *sym;
    CTcSymEnum *old_entry;
    char buf[32];
    int is_token;

    /* read the symbol name */
    if ((sym = base_read_from_sym_file(fp)) == 0)
        return 0;

    /* read the 'token' flag */
    fp->read_bytes(buf, 1);
    is_token = ((buf[0] & 1) != 0);

    /* 
     *   If this enumerator is already defined, this is a harmless
     *   redefinition - every symbol file can define the same enumerator
     *   without any problem.  Indicate the harmless redefinition by
     *   returning the original symbol.  
     */
    old_entry = (CTcSymEnum *)
                G_prs->get_global_symtab()->find(sym, strlen(sym));
    if (old_entry != 0 && old_entry->get_type() == TC_SYM_ENUM)
    {
        /* if this is a 'token' enum, mark the old entry as such */
        if (is_token)
            old_entry->set_is_token(TRUE);

        /* return the original entry */
        return old_entry;
    }

    /* create and return the new symbol */
    return new CTcSymEnum(sym, strlen(sym), FALSE,
                          G_prs->new_enum_id(), is_token);
}